

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLFunctionLoader.cpp
# Opt level: O3

FunctionLibrary * __thiscall eglu::GLLibraryCache::getLibrary(GLLibraryCache *this,ApiType apiType)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  bool bVar5;
  pair<unsigned_int,_tcu::FunctionLibrary_*> local_28;
  
  p_Var4 = (this->m_libraries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_libraries)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      bVar5 = p_Var4[1]._M_color < apiType.m_bits;
      if (!bVar5) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar5];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var3[1]._M_color <= apiType.m_bits)) {
      return (FunctionLibrary *)p_Var3[1]._M_parent;
    }
  }
  iVar2 = (*this->m_platform->_vptr_Platform[2])(this->m_platform,apiType.m_bits,this->m_cmdLine);
  local_28.first = apiType.m_bits;
  local_28.second = (FunctionLibrary *)CONCAT44(extraout_var,iVar2);
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,tcu::FunctionLibrary*>,std::_Select1st<std::pair<unsigned_int_const,tcu::FunctionLibrary*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,tcu::FunctionLibrary*>>>
  ::_M_emplace_unique<std::pair<unsigned_int,tcu::FunctionLibrary*>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,tcu::FunctionLibrary*>,std::_Select1st<std::pair<unsigned_int_const,tcu::FunctionLibrary*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,tcu::FunctionLibrary*>>>
              *)&this->m_libraries,&local_28);
  return (FunctionLibrary *)CONCAT44(extraout_var,iVar2);
}

Assistant:

const tcu::FunctionLibrary* GLLibraryCache::getLibrary (glu::ApiType apiType)
{
	tcu::FunctionLibrary*	library	= DE_NULL;
	const deUint32			key		= apiType.getPacked();
	LibraryMap::iterator	iter	= m_libraries.find(key);

	if (iter == m_libraries.end())
	{
		library = m_platform.createDefaultGLFunctionLibrary(apiType, m_cmdLine);
		try
		{
			m_libraries.insert(std::make_pair(key, library));
		}
		catch (...)
		{
			delete library;
			throw;
		}
	}
	else
		library = iter->second;

	return library;
}